

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS ref_metric_interpolation_error2(REF_GRID ref_grid,REF_DBL *scalar)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_DBL RVar1;
  REF_STATUS RVar2;
  uint uVar3;
  uint uVar4;
  REF_DBL *scalar_00;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  undefined8 uVar8;
  long lVar9;
  char *pcVar10;
  int cell;
  double dVar11;
  double local_188;
  REF_DBL integral;
  REF_INT new_cell;
  int local_158;
  int iStack_154;
  int local_150;
  REF_INT local_14c;
  REF_DBL node_area [7];
  REF_INT nodes [27];
  
  ref_node = ref_grid->node;
  lVar9 = (long)ref_node->max;
  if (lVar9 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xe9d,
           "ref_metric_interpolation_error2","malloc dist of REF_DBL negative");
    uVar3 = 1;
  }
  else {
    ref_cell = ref_grid->cell[4];
    scalar_00 = (REF_DBL *)malloc(lVar9 * 8);
    if (scalar_00 == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xe9d,"ref_metric_interpolation_error2","malloc dist of REF_DBL NULL");
      uVar3 = 2;
    }
    else {
      for (lVar5 = 0; lVar9 != lVar5; lVar5 = lVar5 + 1) {
        scalar_00[lVar5] = 0.0;
      }
      local_188 = 0.0;
      for (cell = 0; cell < ref_cell->max; cell = cell + 1) {
        RVar2 = ref_cell_nodes(ref_cell,cell,nodes);
        if (RVar2 == 0) {
          uVar6 = (ulong)(uint)ref_cell->node_per;
          if (ref_cell->node_per < 1) {
            uVar6 = 0;
          }
          for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
            node_area[uVar7] = scalar[nodes[uVar7]];
          }
          uVar3 = ref_node_tri_area(ref_node,nodes,node_area + 6);
          if (uVar3 != 0) {
            uVar6 = (ulong)uVar3;
            pcVar10 = "area";
            uVar8 = 0xea3;
LAB_00175bc7:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,uVar8,"ref_metric_interpolation_error2",uVar6,pcVar10);
            return (REF_STATUS)uVar6;
          }
          uVar3 = ref_metric_integrate2(ref_metric_integrand_quad_err2,node_area,&integral);
          RVar1 = integral;
          if (uVar3 != 0) {
            uVar6 = (ulong)uVar3;
            pcVar10 = "intg";
            uVar8 = 0xea6;
            goto LAB_00175bc7;
          }
          local_158 = nodes[0];
          iStack_154 = nodes[1];
          local_150 = nodes[2];
          local_14c = nodes[6];
          uVar3 = ref_cell_add(ref_grid->cell[3],&local_158,&new_cell);
          if (uVar3 != 0) {
            uVar6 = (ulong)uVar3;
            pcVar10 = "add tri";
            uVar8 = 0xeaf;
            goto LAB_00175bc7;
          }
          local_188 = local_188 + RVar1;
          dVar11 = RVar1 / 3.0;
          scalar_00[local_158] = scalar_00[local_158] + dVar11;
          scalar_00[iStack_154] = scalar_00[iStack_154] + dVar11;
          scalar_00[local_150] = dVar11 + scalar_00[local_150];
        }
      }
      printf("interpolation error %e\n",local_188);
      uVar4 = ref_gather_scalar_by_extension
                        (ref_grid,1,scalar_00,(char **)0x0,"ref_metric_test_dist.plt");
      uVar3 = 0;
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0xeb8,"ref_metric_interpolation_error2",(ulong)uVar4,"dump");
        uVar3 = uVar4;
      }
    }
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_metric_interpolation_error2(REF_GRID ref_grid,
                                                   REF_DBL *scalar) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tr2(ref_grid);
  REF_INT cell, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL node_area[7];
  REF_DBL integral;
  REF_DBL error;
  REF_DBL *dist;

  ref_malloc_init(dist, ref_node_max(ref_node), REF_DBL, 0.0);
  error = 0.0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    each_ref_cell_cell_node(ref_cell, cell_node) {
      node_area[cell_node] = scalar[nodes[cell_node]];
    }
    RSS(ref_node_tri_area(ref_node, nodes, &(node_area[6])), "area");
    RSS(ref_metric_integrate2(ref_metric_integrand_quad_err2, node_area,
                              &integral),
        "intg");
    error += integral;
    {
      REF_CELL tri_cell = ref_grid_tri(ref_grid);
      REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER], new_cell;
      tri_nodes[0] = nodes[0];
      tri_nodes[1] = nodes[1];
      tri_nodes[2] = nodes[2];
      tri_nodes[3] = nodes[6];
      RSS(ref_cell_add(tri_cell, tri_nodes, &new_cell), "add tri");
      dist[tri_nodes[0]] += integral / 3.0;
      dist[tri_nodes[1]] += integral / 3.0;
      dist[tri_nodes[2]] += integral / 3.0;
    }
  }
  printf("interpolation error %e\n", error);
  RSS(ref_gather_scalar_by_extension(ref_grid, 1, dist, NULL,
                                     "ref_metric_test_dist.plt"),
      "dump");

  return REF_SUCCESS;
}